

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O3

uint8_t * __thiscall VC1StreamReader::findNextFrame(VC1StreamReader *this,uint8_t *buffer)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  
  pbVar1 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  for (pbVar3 = buffer + 2; pbVar3 < pbVar1; pbVar3 = pbVar3 + lVar2) {
    lVar2 = 3;
    if (*pbVar3 < 2) {
      if (*pbVar3 == 0) {
        lVar2 = 1;
      }
      else if ((pbVar3[-2] == 0) && (pbVar3[-1] == 0)) {
        pbVar3 = pbVar3 + -2;
        if (pbVar3 < pbVar1 + -4) goto LAB_001e9ed4;
        break;
      }
    }
  }
LAB_001e9f3e:
  pbVar3 = (byte *)0x0;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    pbVar3 = pbVar1;
  }
  return pbVar3;
LAB_001e9ed4:
  if ((pbVar3[3] & 0xef) != 0xc) {
    return pbVar3;
  }
  pbVar3 = pbVar3 + 6;
  if (pbVar3 < pbVar1) {
    do {
      lVar2 = 3;
      if (*pbVar3 < 2) {
        if (*pbVar3 == 0) {
          lVar2 = 1;
        }
        else if ((pbVar3[-2] == 0) && (pbVar3[-1] == 0)) goto LAB_001e9f20;
      }
      pbVar3 = pbVar3 + lVar2;
      if (pbVar1 <= pbVar3) {
        if (((this->super_MPEGStreamReader).m_eof & 1U) == 0) {
          return (uint8_t *)0x0;
        }
        return pbVar1;
      }
    } while( true );
  }
  goto LAB_001e9f3e;
LAB_001e9f20:
  pbVar3 = pbVar3 + -2;
  if (pbVar1 + -4 <= pbVar3) {
    pbVar3 = (byte *)0x0;
    if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
      pbVar3 = pbVar1;
    }
    return pbVar3;
  }
  goto LAB_001e9ed4;
}

Assistant:

uint8_t* VC1StreamReader::findNextFrame(uint8_t* buffer) const
{
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code != VC1Code::FIELD && vc1Code != VC1Code::USER_FIELD)
            return nal;
    }
    if (m_eof)
        return m_bufEnd;
    return nullptr;
}